

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O3

void __thiscall
icu_63::SimpleTimeZone::setStartRule
          (SimpleTimeZone *this,int32_t month,int32_t dayOfMonth,int32_t time,TimeMode mode,
          UErrorCode *status)

{
  this->startMonth = (int8_t)month;
  this->startDay = (int8_t)dayOfMonth;
  this->startDayOfWeek = '\0';
  this->startTime = time;
  this->startTimeMode = mode;
  decodeStartRule(this,status);
  this->transitionRulesInitialized = '\0';
  return;
}

Assistant:

void 
SimpleTimeZone::setStartRule(int32_t month, int32_t dayOfMonth, 
                             int32_t time, TimeMode mode, UErrorCode& status) 
{
    setStartRule(month, dayOfMonth, 0, time, mode, status);
}